

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *local_20;
  long local_18;
  
  local_20 = id;
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmPolicies.cxx"
                  ,0x14,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar4 = strlen(id);
  if ((sVar4 == 7) && (iVar3 = strncmp(id,"CMP",3), iVar3 == 0)) {
    bVar2 = cmHasLiteralSuffix<char_const*,5ul>(&local_20,(char (*) [5])0x51dbc5);
    if (bVar2) {
      *pid = CMP0000;
      return true;
    }
    if ((int)local_20[3] - 0x30U < 10) {
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (lVar5 == 3) goto LAB_00198fea;
        lVar1 = lVar5 + 1;
      } while ((int)local_20[lVar5 + 4] - 0x30U < 10);
      if (5 < lVar5 + 3U) {
LAB_00198fea:
        bVar2 = cmSystemTools::StringToLong(local_20 + 3,&local_18);
        if ((bVar2) && (local_18 < 0x60)) {
          *pid = (PolicyID)local_18;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool cmPolicies::GetPolicyID(const char* id, cmPolicies::PolicyID& pid)
{
  return stringToId(id, pid);
}